

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_pos(char *s,ssize_t i)

{
  size_t len_00;
  size_t sVar1;
  ssize_t in_RSI;
  char *in_RDI;
  size_t len;
  
  len_00 = strlen(in_RDI);
  sVar1 = IDX(in_RSI,len_00);
  return sVar1;
}

Assistant:

size_t
zt_cstr_pos(const char *s, ssize_t i) {
    size_t len;

    zt_assert(s);

    len = strlen(s);
    i   = (ssize_t)IDX(i, len);

    zt_assert(i >= 0 && (size_t)i <= len);
    return (size_t)i;
}